

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subvq.c
# Opt level: O2

void subvq_subvec_eval_logs3(subvq_t *vq,float32 *feat,int32 s,logmath_t *logmath)

{
  uint uVar1;
  vector_gautbl_t *pvVar2;
  int32 *piVar3;
  ulong uVar4;
  ulong uVar5;
  
  pvVar2 = vq->gautbl;
  piVar3 = vq->featdim[s];
  uVar1 = pvVar2[s].veclen;
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    vq->subvec[uVar5] = feat[piVar3[uVar5]];
  }
  vector_gautbl_eval_logs3(pvVar2 + s,0,vq->vqsize,vq->subvec,vq->vqdist[s],logmath);
  return;
}

Assistant:

void
subvq_subvec_eval_logs3(subvq_t * vq, float32 * feat, int32 s, logmath_t * logmath)
{
    int32 i;
    int32 *featdim;

    /* Extract subvector from feat */
    featdim = vq->featdim[s];
    for (i = 0; i < vq->gautbl[s].veclen; i++)
        vq->subvec[i] = feat[featdim[i]];

    /* Evaluate distances between extracted subvector and corresponding codebook */
    vector_gautbl_eval_logs3(&(vq->gautbl[s]), 0, vq->vqsize, vq->subvec,
                             vq->vqdist[s], logmath);
}